

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O2

int __thiscall cmCTestScriptHandler::RunCurrentScript(cmCTestScriptHandler *this)

{
  double dVar1;
  size_type sVar2;
  int iVar3;
  uint __seconds;
  long lVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  string_view arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  envArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  this->ShouldRunCurrentScript = false;
  cmSystemTools::s_RunCommandHideConsole = true;
  iVar3 = ExtractVariables(this);
  if (iVar3 == 0) {
    sVar2 = (this->CTestEnv)._M_string_length;
    if (sVar2 != 0) {
      arg._M_str = (this->CTestEnv)._M_dataplus._M_p;
      arg._M_len = sVar2;
      cmExpandedList_abi_cxx11_(&local_38,arg,false);
      cmSystemTools::AppendEnv(&local_38);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_38);
    }
    if (0.0 <= this->ContinuousDuration) {
      UpdateElapsedTime(this);
      lVar4 = std::chrono::_V2::steady_clock::now();
      dVar1 = this->ContinuousDuration;
      if (this->EmptyBinDirOnce == true) {
        this->EmptyBinDir = true;
      }
      do {
        lVar5 = std::chrono::_V2::steady_clock::now();
        iVar3 = RunConfigurationDashboard(this);
        lVar6 = std::chrono::_V2::steady_clock::now();
        dVar7 = this->MinimumInterval * 1000000000.0;
        if ((double)(lVar6 - lVar5) < dVar7) {
          local_38.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)((dVar7 - (double)(lVar6 - lVar5)) / 1000000000.0);
          __seconds = cmDurationTo<unsigned_int>((cmDuration *)&local_38);
          sleep(__seconds);
        }
        if (this->EmptyBinDirOnce == true) {
          this->EmptyBinDir = false;
        }
        lVar5 = std::chrono::_V2::steady_clock::now();
      } while ((double)lVar5 < dVar1 * 1000000000.0 + (double)lVar4);
    }
    else {
      iVar3 = RunConfigurationDashboard(this);
    }
  }
  return iVar3;
}

Assistant:

int cmCTestScriptHandler::RunCurrentScript()
{
  int result;

  // do not run twice
  this->SetRunCurrentScript(false);

  // no popup widows
  cmSystemTools::SetRunCommandHideConsole(true);

  // extract the vars from the cache and store in ivars
  result = this->ExtractVariables();
  if (result) {
    return result;
  }

  // set any environment variables
  if (!this->CTestEnv.empty()) {
    std::vector<std::string> envArgs = cmExpandedList(this->CTestEnv);
    cmSystemTools::AppendEnv(envArgs);
  }

  // now that we have done most of the error checking finally run the
  // dashboard, we may be asked to repeatedly run this dashboard, such as
  // for a continuous, do we need to run it more than once?
  if (this->ContinuousDuration >= 0) {
    this->UpdateElapsedTime();
    auto ending_time =
      std::chrono::steady_clock::now() + cmDuration(this->ContinuousDuration);
    if (this->EmptyBinDirOnce) {
      this->EmptyBinDir = true;
    }
    do {
      auto startOfInterval = std::chrono::steady_clock::now();
      result = this->RunConfigurationDashboard();
      auto interval = std::chrono::steady_clock::now() - startOfInterval;
      auto minimumInterval = cmDuration(this->MinimumInterval);
      if (interval < minimumInterval) {
        auto sleepTime =
          cmDurationTo<unsigned int>(minimumInterval - interval);
        this->SleepInSeconds(sleepTime);
      }
      if (this->EmptyBinDirOnce) {
        this->EmptyBinDir = false;
      }
    } while (std::chrono::steady_clock::now() < ending_time);
  }
  // otherwise just run it once
  else {
    result = this->RunConfigurationDashboard();
  }

  return result;
}